

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpu_sync_bndcs_hflags_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint local_1c;
  uint local_18;
  uint32_t bndcsr;
  uint32_t hflags2;
  uint32_t hflags;
  CPUX86State *env_local;
  
  uVar1 = env->hflags;
  if ((uVar1 & 3) == 3) {
    local_1c = (uint)(env->bndcs_regs).cfgu;
  }
  else {
    local_1c = (uint)env->msr_bndcfgs;
  }
  if ((((env->cr[4] & 0x40000) == 0) || ((env->xcr0 & 0x10) == 0)) || ((local_1c & 1) == 0)) {
    bndcsr = uVar1 & 0xfdffffff;
  }
  else {
    bndcsr = uVar1 | 0x2000000;
  }
  if ((local_1c & 2) == 0) {
    local_18 = env->hflags2 & 0xffffffdf;
  }
  else {
    local_18 = env->hflags2 | 0x20;
  }
  env->hflags = bndcsr;
  env->hflags2 = local_18;
  return;
}

Assistant:

void cpu_sync_bndcs_hflags(CPUX86State *env)
{
    uint32_t hflags = env->hflags;
    uint32_t hflags2 = env->hflags2;
    uint32_t bndcsr;

    if ((hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    if ((env->cr[4] & CR4_OSXSAVE_MASK)
        && (env->xcr0 & XSTATE_BNDCSR_MASK)
        && (bndcsr & BNDCFG_ENABLE)) {
        hflags |= HF_MPX_EN_MASK;
    } else {
        hflags &= ~HF_MPX_EN_MASK;
    }

    if (bndcsr & BNDCFG_BNDPRESERVE) {
        hflags2 |= HF2_MPX_PR_MASK;
    } else {
        hflags2 &= ~HF2_MPX_PR_MASK;
    }

    env->hflags = hflags;
    env->hflags2 = hflags2;
}